

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_unittests.cc
# Opt level: O0

void __thiscall cpp_mediator_send_receive2_Test::TestBody(cpp_mediator_send_receive2_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_78;
  Message local_70;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_48 [4];
  response_type actual;
  Reqb request_b;
  undefined1 local_28 [8];
  mediator<ReqHandlerb_&> m;
  ReqHandlerb handlerb;
  cpp_mediator_send_receive2_Test *this_local;
  
  m.handlers_.super__Tuple_impl<0UL,_ReqHandlerb_&>.super__Head_base<0UL,_ReqHandlerb_&,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_ReqHandlerb_&>)(_Head_base<0UL,_ReqHandlerb_&,_false>)0x0;
  ReqHandlerb::ReqHandlerb((ReqHandlerb *)&m.handlers_);
  holden::make_mediator<ReqHandlerb>((holden *)local_28,(ReqHandlerb *)&m.handlers_);
  Reqb::Reqb((Reqb *)local_48,1000);
  gtest_ar.message_.ptr_._4_4_ =
       holden::mediator<ReqHandlerb_&>::send<Reqb>
                 ((mediator<ReqHandlerb_&> *)local_28,(Reqb *)local_48);
  local_64 = 1000;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_60,"1000","actual",&local_64,
             (int *)((long)&gtest_ar.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
               ,0x92,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  Reqb::~Reqb((Reqb *)local_48);
  holden::mediator<ReqHandlerb_&>::~mediator((mediator<ReqHandlerb_&> *)local_28);
  ReqHandlerb::~ReqHandlerb((ReqHandlerb *)&m.handlers_);
  return;
}

Assistant:

TEST(cpp_mediator, send_receive2) {
  SendForWithArgs(b, 1000);
  ASSERT_EQ(1000, actual);
}